

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O3

void init_dungeons(void)

{
  dungeon *__dest;
  d_level *pdVar1;
  ulong uVar2;
  s_level *psVar3;
  boolean bVar4;
  byte bVar5;
  xchar xVar6;
  char cVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  dlb *dp;
  size_t sVar13;
  branch *pbVar14;
  s_level *psVar15;
  int iVar16;
  int iVar17;
  dlb *in_RCX;
  dlb *pdVar18;
  undefined7 uVar20;
  dlb *pdVar19;
  byte bVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  tmpbranch *ptVar25;
  s_level **ppsVar26;
  ulong uVar27;
  long lVar28;
  level_map *plVar29;
  s_level **ppsVar30;
  branch *pbVar31;
  s_level *psVar32;
  char *__s1;
  s_level **ppsVar33;
  int iVar34;
  long lVar35;
  s_level **ppsVar36;
  int iVar37;
  tmplevel *__src;
  s_level **ppsVar38;
  s_level **ppsVar39;
  version_info vers_info;
  char tbuf [256];
  undefined1 auStack_1608 [8];
  undefined8 uStack_1600;
  undefined8 local_15f8;
  s_level *local_15f0 [32];
  proto_dungeon local_14f0;
  
  local_14f0.n_levs = 0;
  local_14f0.n_brs = 0;
  dp = dlb_fopen("dungeon","r");
  if (dp == (dlb *)0x0) {
    sprintf((char *)&local_15f8,"Cannot open dungeon description - \"%s","dungeon");
    sVar13 = strlen((char *)&local_15f8);
    *(undefined8 *)((long)local_15f0 + (sVar13 - 8)) = 0x206d6f72662022;
    sVar13 = strlen((char *)&local_15f8);
    *(undefined2 *)((long)local_15f0 + (sVar13 - 8)) = 0x220a;
    *(undefined1 *)((long)local_15f0 + (sVar13 - 6)) = 0;
    if (fqn_prefix[1] != (char *)0x0) {
      strcat((char *)&local_15f8,fqn_prefix[1]);
    }
    sVar13 = strlen((char *)&local_15f8);
    *(undefined4 *)((long)local_15f0 + (sVar13 - 8)) = 0x6164686e;
    *(undefined2 *)((long)local_15f0 + (sVar13 - 4)) = 0x74;
    sVar13 = strlen((char *)&local_15f8);
    *(undefined8 *)((long)local_15f0 + (sVar13 - 8)) = 0x21656c69662022;
    panic((char *)&local_15f8);
  }
  iVar12 = (int)dp;
  Fread(auStack_1608 + 4,0xc,iVar12,in_RCX);
  bVar4 = check_version((version_info *)(auStack_1608 + 4),"dungeon",'\x01');
  if (bVar4 == '\0') {
    panic("Dungeon description not valid.");
  }
  sp_levchn = (s_level *)0x0;
  Fread(&n_dgns,4,iVar12,in_RCX);
  iVar16 = n_dgns;
  if (0xf < n_dgns) {
    panic("init_dungeons: too many dungeons");
  }
  memset(dungeons,0,0x380);
  if (0 < iVar16) {
    pdVar18 = (dlb *)0x0;
    lVar35 = 0;
    lVar28 = 0;
    do {
      iVar16 = (int)pdVar18;
      lVar23 = (long)iVar16;
      pdVar19 = pdVar18;
      Fread(local_14f0.tmpdungeon + lVar23,0x4c,iVar12,pdVar18);
      iVar37 = (int)lVar28;
      iVar34 = (int)lVar35;
      if ((flags.debug == '\0') && (iVar9 = local_14f0.tmpdungeon[lVar23].chance, iVar9 != 0)) {
        uVar8 = mt_random();
        pdVar19 = (dlb *)(ulong)((uVar8 / 100) * 100);
        if ((int)(uVar8 % 100) < iVar9) goto LAB_0018a962;
        if (0 < local_14f0.tmpdungeon[lVar23].levels) {
          iVar9 = 0;
          do {
            Fread(local_14f0.tmplevel + iVar37,0x30,iVar12,pdVar19);
            iVar9 = iVar9 + 1;
          } while (iVar9 < local_14f0.tmpdungeon[lVar23].levels);
        }
        if (0 < local_14f0.tmpdungeon[lVar23].branches) {
          pdVar18 = (dlb *)local_14f0.tmpbranch;
          ptVar25 = (tmpbranch *)pdVar18 + iVar34;
          iVar37 = 0;
          do {
            Fread(ptVar25,0x28,iVar12,pdVar18);
            iVar37 = iVar37 + 1;
          } while (iVar37 < local_14f0.tmpdungeon[lVar23].branches);
        }
        n_dgns = n_dgns + -1;
        iVar16 = iVar16 + -1;
      }
      else {
LAB_0018a962:
        __dest = dungeons + lVar23;
        strcpy(__dest->dname,local_14f0.tmpdungeon[lVar23].name);
        strcpy(dungeons[lVar23].proto,local_14f0.tmpdungeon[lVar23].protoname);
        dungeons[lVar23].boneid = local_14f0.tmpdungeon[lVar23].boneschar;
        lVar24 = (long)local_14f0.tmpdungeon[lVar23].lev.rand;
        if (lVar24 == 0) {
          bVar21 = (byte)local_14f0.tmpdungeon[lVar23].lev.base;
        }
        else {
          uVar8 = mt_random();
          bVar21 = SUB161(ZEXT416(uVar8) % SEXT816(lVar24),0) +
                   (char)local_14f0.tmpdungeon[lVar23].lev.base;
        }
        dungeons[lVar23].num_dunlevs = bVar21;
        if (iVar16 == 0) {
          dungeons[lVar23].depth_start = 1;
          uVar20 = (undefined7)((ulong)pdVar19 >> 8);
          iVar9 = 0;
        }
        else {
          iVar9 = (int)dungeons[iVar16 + -1].num_dunlevs + dungeons[iVar16 + -1].ledger_start;
          uVar20 = 0;
        }
        dungeons[lVar23].ledger_start = iVar9;
        *(bool *)(lVar23 * 0x38 + 0x31de1e) = iVar16 == 0;
        uVar27 = CONCAT71(uVar20,*(undefined1 *)&dungeons[lVar23].flags) & 0xffffffffffffff81;
        *(byte *)&dungeons[lVar23].flags =
             (byte)local_14f0.tmpdungeon[lVar23].flags & 0x7e | (byte)uVar27;
        uVar8 = local_14f0.tmpdungeon[lVar23].entry_lev;
        if ((int)uVar8 < 0) {
          bVar5 = (char)uVar8 + bVar21;
          pdVar19 = (dlb *)(ulong)(byte)(bVar5 + 1);
          if (0x7e < bVar5) {
            pdVar19 = (dlb *)0x1;
          }
LAB_0018ab04:
          dungeons[lVar23].entry_lev = (xchar)pdVar19;
        }
        else {
          if (uVar8 != 0) {
            pdVar19 = (dlb *)(ulong)bVar21;
            if ((char)uVar8 <= (char)bVar21) {
              pdVar19 = (dlb *)(ulong)uVar8;
            }
            goto LAB_0018ab04;
          }
          dungeons[lVar23].entry_lev = '\x01';
          pdVar19 = (dlb *)CONCAT71((int7)(uVar27 >> 8),1);
        }
        if (iVar16 != 0) {
          iVar10 = find_branch(__dest->dname,&local_14f0);
          pbVar14 = (branch *)calloc(1,0x18);
          iVar9 = branch_id + 1;
          pbVar14->id = branch_id;
          branch_id = iVar9;
          iVar9 = local_14f0.tmpbranch[iVar10].type;
          switch(iVar9) {
          case 0:
          case 3:
            break;
          case 1:
            iVar9 = (local_14f0.tmpbranch[iVar10].up == 0) + 1;
            break;
          case 2:
            iVar9 = 2 - (uint)(local_14f0.tmpbranch[iVar10].up == 0);
            break;
          default:
            iVar9 = 0;
            impossible("correct_branch_type: unknown branch type");
          }
          pbVar14->type = iVar9;
          xVar6 = parent_dnum(__dest->dname,&local_14f0);
          (pbVar14->end1).dnum = xVar6;
          xVar6 = parent_dnum(__dest->dname,&local_14f0);
          iVar9 = find_branch(__dest->dname,&local_14f0);
          iVar11 = level_range(xVar6,(int)local_14f0.tmpbranch[iVar9].lev.base,
                               (int)local_14f0.tmpbranch[iVar9].lev.rand,
                               local_14f0.tmpbranch[iVar9].chain,&local_14f0,(int *)&local_15f8);
          uVar8 = mt_random();
          iVar22 = SUB164(ZEXT416(uVar8) % SEXT816((long)iVar11),0);
          iVar9 = iVar22;
          while( true ) {
            iVar9 = iVar9 + 1;
            if (iVar11 <= iVar9) {
              iVar9 = 0;
            }
            iVar17 = iVar9;
            if (branches == (branch *)0x0) break;
            iVar17 = iVar9 + (int)local_15f8;
            pbVar31 = branches;
            while ((((pbVar31->end1).dnum != xVar6 || (iVar17 != (pbVar31->end1).dlevel)) &&
                   (((pbVar31->end2).dnum != xVar6 || (iVar17 != (pbVar31->end2).dlevel))))) {
              pbVar31 = pbVar31->next;
              if (pbVar31 == (branch *)0x0) goto LAB_0018aca5;
            }
            iVar17 = iVar22;
            if (iVar9 == iVar22) break;
          }
          iVar17 = iVar17 + (int)local_15f8;
LAB_0018aca5:
          (pbVar14->end1).dlevel = (xchar)iVar17;
          (pbVar14->end2).dnum = (xchar)pdVar18;
          iVar9 = local_14f0.tmpbranch[iVar10].up;
          (pbVar14->end2).dlevel = (xchar)pdVar19;
          pbVar14->end1_up = iVar9 != 0;
          insert_branch(pbVar14,'\0');
          iVar9 = (int)(pbVar14->end1).dnum;
          if (iVar16 == iVar9) {
            cVar7 = (char)dungeons[(pbVar14->end2).dnum].depth_start + (pbVar14->end2).dlevel;
            bVar4 = pbVar14->end1_up == '\0';
          }
          else {
            cVar7 = (char)dungeons[iVar9].depth_start + (pbVar14->end1).dlevel;
            bVar4 = pbVar14->end1_up;
          }
          uVar8 = -(uint)(bVar4 != '\0') | 1;
          if (pbVar14->type == 3) {
            uVar8 = 0;
          }
          uVar8 = ((uVar8 + (int)(char)(cVar7 + -1)) - (int)dungeons[lVar23].entry_lev) + 1;
          pdVar19 = (dlb *)(ulong)uVar8;
          dungeons[lVar23].depth_start = uVar8;
          bVar21 = dungeons[lVar23].num_dunlevs;
        }
        if (' ' < (char)bVar21) {
          dungeons[lVar23].num_dunlevs = ' ';
        }
        local_14f0.start = local_14f0.n_levs;
        local_14f0.n_levs = local_14f0.n_levs + local_14f0.tmpdungeon[lVar23].levels;
        if (0x32 < local_14f0.n_levs) {
          panic("init_dungeon: too many special levels");
        }
        if (iVar37 < local_14f0.n_levs) {
          lVar28 = (long)iVar37;
          __src = local_14f0.tmplevel + lVar28;
          do {
            Fread(__src,0x30,iVar12,pdVar19);
            local_14f0.final_lev[lVar28] = (s_level *)0x0;
            if (flags.debug == '\0') {
              iVar37 = __src->chance;
              uVar8 = mt_random();
              pdVar19 = (dlb *)(ulong)((uVar8 / 100) * 100);
              if ((int)(uVar8 % 100) < iVar37) goto LAB_0018ae02;
            }
            else {
LAB_0018ae02:
              psVar15 = (s_level *)calloc(1,0x20);
              local_14f0.final_lev[lVar28] = psVar15;
              strcpy(psVar15->proto,__src->name);
              psVar15->boneid = __src->boneschar;
              (psVar15->dlevel).dnum = (xchar)pdVar18;
              uVar8 = __src->flags;
              pdVar19 = (dlb *)(ulong)uVar8;
              bVar21 = (byte)uVar8 & 0xf | *(byte *)&psVar15->flags & 0x80;
              *(byte *)&psVar15->flags = (byte)uVar8 & 0x70 | bVar21;
              if ((uVar8 & 0x70) == 0) {
                uVar27 = (ulong)CONCAT31((int3)(uVar8 >> 8),
                                         (char)local_14f0.tmpdungeon[lVar23].flags) &
                         0xffffffffffffff70;
                bVar21 = (byte)uVar27 | bVar21;
                pdVar19 = (dlb *)CONCAT71((int7)(uVar27 >> 8),bVar21);
                *(byte *)&psVar15->flags = bVar21;
              }
              psVar15->rndlevs = (uchar)__src->rndlevs;
              psVar15->next = (s_level *)0x0;
            }
            lVar28 = lVar28 + 1;
            __src = __src + 1;
          } while (lVar28 < local_14f0.n_levs);
        }
        bVar4 = place_level(local_14f0.start,&local_14f0);
        if (bVar4 == '\0') {
          panic("init_dungeon:  couldn\'t place levels");
        }
        lVar24 = (long)local_14f0.start;
        if (local_14f0.start < local_14f0.n_levs) {
          do {
            psVar15 = local_14f0.final_lev[lVar24];
            if (psVar15 != (s_level *)0x0) {
              if (sp_levchn == (s_level *)0x0) {
                ppsVar38 = &sp_levchn;
                psVar32 = (s_level *)0x0;
              }
              else {
                ppsVar38 = &((s_level *)0x0)->next;
                psVar3 = sp_levchn;
                do {
                  psVar32 = psVar3;
                  if (((psVar32->dlevel).dnum == (psVar15->dlevel).dnum) &&
                     ((psVar15->dlevel).dlevel < (psVar32->dlevel).dlevel)) {
                    if ((s_level *)ppsVar38 == (s_level *)0x0) {
                      ppsVar38 = &sp_levchn;
                      psVar32 = sp_levchn;
                    }
                    goto LAB_0018af33;
                  }
                  ppsVar38 = &psVar32->next;
                  psVar3 = psVar32->next;
                } while (psVar32->next != (s_level *)0x0);
                psVar32 = (s_level *)0x0;
              }
LAB_0018af33:
              psVar15->next = psVar32;
              ((s_level *)ppsVar38)->next = psVar15;
            }
            lVar24 = lVar24 + 1;
          } while (lVar24 != local_14f0.n_levs);
          local_14f0.start = local_14f0.n_levs;
        }
        local_14f0.n_brs = local_14f0.n_brs + local_14f0.tmpdungeon[lVar23].branches;
        if (0x20 < local_14f0.n_brs) {
          panic("init_dungeon: too many branches");
        }
        if (iVar34 < local_14f0.n_brs) {
          lVar35 = (long)iVar34;
          pdVar18 = (dlb *)local_14f0.tmpbranch;
          ptVar25 = (tmpbranch *)pdVar18 + lVar35;
          do {
            Fread(ptVar25,0x28,iVar12,pdVar18);
            lVar35 = lVar35 + 1;
            ptVar25 = ptVar25 + 1;
          } while (lVar35 < local_14f0.n_brs);
        }
      }
      pdVar18 = (dlb *)(ulong)(iVar16 + 1U);
    } while ((int)(iVar16 + 1U) < n_dgns);
  }
  dlb_fclose(dp);
  lVar28 = 0;
  do {
    uVar8 = mt_random();
    tune[lVar28] = (char)(uVar8 / 7) * -7 + (char)uVar8 + 'A';
    lVar28 = lVar28 + 1;
  } while (lVar28 != 5);
  tune[5] = '\0';
  plVar29 = level_map;
  __s1 = "advcal";
LAB_0018b04e:
  iVar12 = strncmp(__s1,"rogue",6);
  if ((iVar12 != 0) || (flags.rogue_enabled != '\0')) {
    ppsVar38 = &sp_levchn;
    do {
      ppsVar38 = &((s_level *)ppsVar38)->next->next;
      if ((s_level *)ppsVar38 == (s_level *)0x0) goto LAB_0018b06c;
      iVar12 = strncasecmp(__s1,((s_level *)ppsVar38)->proto,0xffffffffffffffff);
    } while (iVar12 != 0);
    pdVar1 = plVar29->lev_spec;
    pdVar1->dnum = (((s_level *)ppsVar38)->dlevel).dnum;
    pdVar1->dlevel = (((s_level *)ppsVar38)->dlevel).dlevel;
    if ((*__s1 == 'x') && (__s1[1] == '-')) {
      sprintf(((s_level *)ppsVar38)->proto,"%s%s",urole.filecode);
      goto LAB_0018b06c;
    }
    pbVar14 = branches;
    if (pdVar1 == &dungeon_topology.d_knox_level) {
      for (; pbVar14 != (branch *)0x0; pbVar14 = pbVar14->next) {
        if (((pbVar14->end2).dnum == dungeon_topology.d_knox_level.dnum) &&
           ((pbVar14->end2).dlevel == dungeon_topology.d_knox_level.dlevel)) goto LAB_0018b161;
      }
    }
    else {
      if (pdVar1 != &dungeon_topology.d_advcal_level) goto LAB_0018b06c;
      for (; pbVar14 != (branch *)0x0; pbVar14 = pbVar14->next) {
        if (((pbVar14->end2).dnum == dungeon_topology.d_advcal_level.dnum) &&
           ((pbVar14->end2).dlevel == dungeon_topology.d_advcal_level.dlevel)) goto LAB_0018b161;
      }
    }
    pbVar14 = (branch *)0x0;
    goto LAB_0018b16d;
  }
  goto LAB_0018b06c;
LAB_0018b161:
  (pbVar14->end1).dnum = (xchar)n_dgns;
LAB_0018b16d:
  insert_branch(pbVar14,'\x01');
LAB_0018b06c:
  __s1 = plVar29[1].lev_name;
  plVar29 = plVar29 + 1;
  if (*__s1 == '\0') goto LAB_0018b17c;
  goto LAB_0018b04e;
LAB_0018b17c:
  if (flags.rogue_enabled == '\0') {
    ppsVar38 = &sp_levchn;
    psVar15 = (s_level *)0x0;
    do {
      ppsVar39 = &psVar15->next;
      ppsVar38 = &((s_level *)ppsVar38)->next->next;
      if ((s_level *)ppsVar38 == (s_level *)0x0) goto LAB_0018b1cb;
      iVar12 = strncmp(((s_level *)ppsVar38)->proto,"rogue",6);
      psVar15 = (s_level *)ppsVar38;
    } while (iVar12 != 0);
    if ((s_level *)ppsVar39 == (s_level *)0x0) {
      ppsVar39 = &sp_levchn;
    }
    ((s_level *)ppsVar39)->next = ((s_level *)ppsVar38)->next;
  }
LAB_0018b1cb:
  dungeon_topology.d_quest_dnum = dname_to_dnum("The Quest",'\0');
  dungeon_topology.d_sokoban_dnum = dname_to_dnum("Sokoban",'\0');
  dungeon_topology.d_mines_dnum = dname_to_dnum("The Gnomish Mines",'\0');
  dungeon_topology.d_tower_dnum = dname_to_dnum("Vlad\'s Tower",'\0');
  dungeon_topology.d_mall_dnum = dname_to_dnum("Town",'\0');
  dungeon_topology.d_dragon_dnum = dname_to_dnum("The Dragon Caves",'\x01');
  ppsVar38 = &sp_levchn;
  do {
    ppsVar38 = &((s_level *)ppsVar38)->next->next;
    if ((s_level *)ppsVar38 == (s_level *)0x0) goto LAB_0018b29e;
    iVar12 = strncasecmp("dummy",((s_level *)ppsVar38)->proto,0xffffffffffffffff);
  } while (iVar12 != 0);
  cVar7 = (((s_level *)ppsVar38)->dlevel).dnum;
  if (1 - dungeons[cVar7].depth_start < (int)dungeons[cVar7].num_dunlevs) {
    dungeons[cVar7].depth_start = dungeons[cVar7].depth_start + -1;
  }
LAB_0018b29e:
  ppsVar38 = &sp_levchn;
  do {
    ppsVar38 = &((s_level *)ppsVar38)->next->next;
    if ((s_level *)ppsVar38 == (s_level *)0x0) break;
    iVar12 = strncasecmp("dummy",((s_level *)ppsVar38)->proto,0xffffffffffffffff);
  } while (iVar12 != 0);
  ppsVar39 = &sp_levchn;
  do {
    ppsVar39 = &((s_level *)ppsVar39)->next->next;
    if ((s_level *)ppsVar39 == (s_level *)0x0) break;
    iVar12 = strncasecmp("earth",((s_level *)ppsVar39)->proto,0xffffffffffffffff);
  } while (iVar12 != 0);
  ppsVar33 = &sp_levchn;
  do {
    ppsVar33 = &((s_level *)ppsVar33)->next->next;
    if ((s_level *)ppsVar33 == (s_level *)0x0) break;
    iVar12 = strncasecmp("air",((s_level *)ppsVar33)->proto,0xffffffffffffffff);
  } while (iVar12 != 0);
  ppsVar36 = &sp_levchn;
  do {
    ppsVar36 = &((s_level *)ppsVar36)->next->next;
    if ((s_level *)ppsVar36 == (s_level *)0x0) break;
    iVar12 = strncasecmp("fire",((s_level *)ppsVar36)->proto,0xffffffffffffffff);
  } while (iVar12 != 0);
  ppsVar26 = &sp_levchn;
  do {
    ppsVar26 = &((s_level *)ppsVar26)->next->next;
    if ((s_level *)ppsVar26 == (s_level *)0x0) break;
    iVar12 = strncasecmp("water",((s_level *)ppsVar26)->proto,0xffffffffffffffff);
  } while (iVar12 != 0);
  ppsVar30 = &sp_levchn;
  do {
    ppsVar30 = &((s_level *)ppsVar30)->next->next;
    if ((s_level *)ppsVar30 == (s_level *)0x0) break;
    iVar12 = strncasecmp("astral",((s_level *)ppsVar30)->proto,0xffffffffffffffff);
  } while (iVar12 != 0);
  uVar27 = 4;
  local_15f8 = (s_level *)ppsVar26;
  local_15f0[0] = (s_level *)ppsVar36;
  local_15f0[1] = (s_level *)ppsVar33;
  local_15f0[2] = (s_level *)ppsVar39;
  do {
    uVar8 = mt_random();
    uVar2 = (ulong)uVar8 % (uVar27 & 0xffffffff);
    psVar15 = local_15f0[uVar2 - 1];
    local_15f0[uVar2 - 1] = (s_level *)(&uStack_1600)[uVar27];
    (&uStack_1600)[uVar27] = psVar15;
    uVar27 = uVar27 - 1;
  } while (1 < uVar27);
  ((s_level *)ppsVar30)->next = local_15f0[2];
  uVar27 = 4;
  do {
    psVar15 = *(s_level **)(auStack_1608 + uVar27 * 8);
    local_15f0[2]->next = psVar15;
    uVar27 = uVar27 - 1;
    local_15f0[2] = psVar15;
  } while (1 < uVar27);
  local_15f8->next = (s_level *)ppsVar38;
  return;
}

Assistant:

void init_dungeons(void)	/* initialize the "dungeon" structs */
{
	dlb	*dgn_file;
	int i, cl = 0, cb = 0;
	s_level *x;
	struct proto_dungeon pd;
	const struct level_map *lev_map;
	struct version_info vers_info;

	pd.n_levs = pd.n_brs = 0;

	dgn_file = dlb_fopen(DUNGEON_FILE, RDBMODE);
	if (!dgn_file) {
	    char tbuf[BUFSZ];
	    sprintf(tbuf, "Cannot open dungeon description - \"%s",
		DUNGEON_FILE);
	    strcat(tbuf, "\" from ");
	    strcat(tbuf, "\n\"");
	    if (fqn_prefix[DATAPREFIX]) strcat(tbuf, fqn_prefix[DATAPREFIX]);
	    strcat(tbuf, DLBFILE);
	    strcat(tbuf, "\" file!");
	    panic(tbuf);
	}

	/* validate the data's version against the program's version */
	Fread(&vers_info, sizeof vers_info, 1, dgn_file);
	
	if (!check_version(&vers_info, DUNGEON_FILE, TRUE))
	    panic("Dungeon description not valid.");

	/*
	 * Read in each dungeon and transfer the results to the internal
	 * dungeon arrays.
	 */
	sp_levchn = NULL;
	Fread(&n_dgns, sizeof(int), 1, dgn_file);
	if (n_dgns >= MAXDUNGEON)
	    panic("init_dungeons: too many dungeons");

	/*
	 * Zero-out dungeons to prevent replay desyncs, specifically the data
	 * beyond the ends of each dungeon's name/protoname fields.
	 */
	memset(dungeons, 0, MAXDUNGEON * sizeof(dungeon));

	for (i = 0; i < n_dgns; i++) {
	    Fread(&pd.tmpdungeon[i], sizeof(struct tmpdungeon), 1, dgn_file);
	    if (!wizard)
	      if (pd.tmpdungeon[i].chance && (pd.tmpdungeon[i].chance <= rn2(100))) {
		int j;

		/* skip over any levels or branches */
		for (j = 0; j < pd.tmpdungeon[i].levels; j++)
		    Fread(&pd.tmplevel[cl], sizeof(struct tmplevel), 1, dgn_file);

		for (j = 0; j < pd.tmpdungeon[i].branches; j++)
		    Fread(&pd.tmpbranch[cb],
					sizeof(struct tmpbranch), 1, dgn_file);
		n_dgns--; i--;
		continue;
	      }

	    strcpy(dungeons[i].dname, pd.tmpdungeon[i].name);
	    strcpy(dungeons[i].proto, pd.tmpdungeon[i].protoname);
	    dungeons[i].boneid = pd.tmpdungeon[i].boneschar;

	    if (pd.tmpdungeon[i].lev.rand)
		dungeons[i].num_dunlevs = (xchar)rn1(pd.tmpdungeon[i].lev.rand,
						     pd.tmpdungeon[i].lev.base);
	    else dungeons[i].num_dunlevs = (xchar)pd.tmpdungeon[i].lev.base;

	    if (!i) {
		dungeons[i].ledger_start = 0;
		dungeons[i].depth_start = 1;
		dungeons[i].dunlev_ureached = 1;
	    } else {
		dungeons[i].ledger_start = dungeons[i-1].ledger_start +
					      dungeons[i-1].num_dunlevs;
		dungeons[i].dunlev_ureached = 0;
	    }

	    dungeons[i].flags.hellish = !!(pd.tmpdungeon[i].flags & HELLISH);
	    dungeons[i].flags.maze_like = !!(pd.tmpdungeon[i].flags & MAZELIKE);
	    dungeons[i].flags.rogue_like = !!(pd.tmpdungeon[i].flags & ROGUELIKE);
	    dungeons[i].flags.align = ((pd.tmpdungeon[i].flags & D_ALIGN_MASK) >> 4);
	    /*
	     * Set the entry level for this dungeon.  The pd.tmpdungeon entry
	     * value means:
	     *		< 0	from bottom (-1 == bottom level)
	     *		  0	default (top)
	     *		> 0	actual level (1 = top)
	     *
	     * Note that the entry_lev field in the dungeon structure is
	     * redundant.  It is used only here and in print_dungeon().
	     */
	    if (pd.tmpdungeon[i].entry_lev < 0) {
		dungeons[i].entry_lev = dungeons[i].num_dunlevs +
						pd.tmpdungeon[i].entry_lev + 1;
		if (dungeons[i].entry_lev <= 0) dungeons[i].entry_lev = 1;
	    } else if (pd.tmpdungeon[i].entry_lev > 0) {
		dungeons[i].entry_lev = pd.tmpdungeon[i].entry_lev;
		if (dungeons[i].entry_lev > dungeons[i].num_dunlevs)
		    dungeons[i].entry_lev = dungeons[i].num_dunlevs;
	    } else { /* default */
		dungeons[i].entry_lev = 1;	/* defaults to top level */
	    }

	    if (i) {	/* set depth */
		branch *br;
		schar from_depth;
		boolean from_up;

		br = add_branch(i, dungeons[i].entry_lev, &pd);

		/* Get the depth of the connecting end. */
		if (br->end1.dnum == i) {
		    from_depth = depth(&br->end2);
		    from_up = !br->end1_up;
		} else {
		    from_depth = depth(&br->end1);
		    from_up = br->end1_up;
		}

		/*
		 * Calculate the depth of the top of the dungeon via
		 * its branch.  First, the depth of the entry point:
		 *
		 *	depth of branch from "parent" dungeon
		 *	+ -1 or 1 depending on a up or down stair or
		 *	  0 if portal
		 *
		 * Followed by the depth of the top of the dungeon:
		 *
		 *	- (entry depth - 1)
		 *
		 * We'll say that portals stay on the same depth.
		 */
		dungeons[i].depth_start = from_depth
					+ (br->type == BR_PORTAL ? 0 :
							(from_up ? -1 : 1))
					- (dungeons[i].entry_lev - 1);
	    }

	    /* this is redundant - it should have been flagged by dgn_comp */
	    if (dungeons[i].num_dunlevs > MAXLEVEL)
		dungeons[i].num_dunlevs = MAXLEVEL;

	    pd.start = pd.n_levs;	/* save starting point */
	    pd.n_levs += pd.tmpdungeon[i].levels;
	    if (pd.n_levs > LEV_LIMIT)
		panic("init_dungeon: too many special levels");
	    
	    /*
	     * Read in the prototype special levels.  Don't add generated
	     * special levels until they are all placed.
	     */
	    for (; cl < pd.n_levs; cl++) {
		Fread(&pd.tmplevel[cl], sizeof(struct tmplevel), 1, dgn_file);
		init_level(i, cl, &pd);
	    }
	    
	    /*
	     * Recursively place the generated levels for this dungeon.  This
	     * routine will attempt all possible combinations before giving
	     * up.
	     */
	    if (!place_level(pd.start, &pd))
		panic("init_dungeon:  couldn't place levels");

	    for (; pd.start < pd.n_levs; pd.start++)
		if (pd.final_lev[pd.start]) add_level(pd.final_lev[pd.start]);


	    pd.n_brs += pd.tmpdungeon[i].branches;
	    if (pd.n_brs > BRANCH_LIMIT)
		panic("init_dungeon: too many branches");
	    for (; cb < pd.n_brs; cb++)
		Fread(&pd.tmpbranch[cb],
					sizeof(struct tmpbranch), 1, dgn_file);
	}
	dlb_fclose(dgn_file);

	for (i = 0; i < 5; i++) tune[i] = 'A' + rn2(7);
	tune[5] = 0;

	/*
	 * Find most of the special levels and dungeons so we can access their
	 * locations quickly.
	 */
	for (lev_map = level_map; lev_map->lev_name[0]; lev_map++) {
		/* 
		 * suppress finding the rogue level if it is not enabled
		 * this makes Is_rogue_level(x) fail
		 */
		if (!strncmp(lev_map->lev_name, "rogue", 6) &&
		    !flags.rogue_enabled)
		    continue;
		
		x = find_level(lev_map->lev_name);
		if (x) {
			assign_level(lev_map->lev_spec, &x->dlevel);
			if (!strncmp(lev_map->lev_name, "x-", 2)) {
				/* This is where the name substitution on the
				 * levels of the quest dungeon occur.
				 */
				sprintf(x->proto, "%s%s", urole.filecode, &lev_map->lev_name[1]);
			} else if (lev_map->lev_spec == &knox_level) {
				branch *br;
				/*
				 * Kludge to allow floating Knox entrance.  We
				 * specify a floating entrance by the fact that
				 * its entrance (end1) has a bogus dnum, namely
				 * n_dgns.
				 */
				for (br = branches; br; br = br->next)
				    if (on_level(&br->end2, &knox_level)) break;

				if (br) br->end1.dnum = n_dgns;
				/* adjust the branch's position on the list */
				insert_branch(br, TRUE);
			} else if (lev_map->lev_spec == &advcal_level) {
				branch *br;
				/*
				 * Kludge to allow floating advcal entrance.  We
				 * specify a floating entrance by the fact that
				 * its entrance (end1) has a bogus dnum, namely
				 * n_dgns.
				 */
				for (br = branches; br; br = br->next)
				    if (on_level(&br->end2, &advcal_level)) break;

				if (br) br->end1.dnum = n_dgns;
				/* adjust the branch's position on the list */
				insert_branch(br, TRUE);
			}
		}
	}
	
	if (!flags.rogue_enabled) {
	    /* 
	     * remove rogue level from the special level chain
	     * This makes Is_special(x) return NULL, so the level will never be
	     * instantiated
	     */
	    s_level *s_curr, *s_prev;
	    s_prev = NULL;
	    for (s_curr = sp_levchn; s_curr; s_curr = s_curr->next) {
		if (!strncmp(s_curr->proto, "rogue", 6)) {
		    if (s_prev)
			s_prev->next = s_curr->next;
		    else
			sp_levchn = s_curr->next;
		    
		    break;
		}
		s_prev = s_curr;
	    }
	}

/*
 *	I hate hardwiring these names. :-(
 */
	quest_dnum = dname_to_dnum("The Quest", FALSE);
	sokoban_dnum = dname_to_dnum("Sokoban", FALSE);
	mines_dnum = dname_to_dnum("The Gnomish Mines", FALSE);
	tower_dnum = dname_to_dnum("Vlad's Tower", FALSE);
	mall_dnum = dname_to_dnum("Town", FALSE);
	dragon_dnum = dname_to_dnum("The Dragon Caves", TRUE);

	/* one special fixup for dummy surface level */
	if ((x = find_level("dummy")) != 0) {
	    i = x->dlevel.dnum;
	    /* the code above puts earth one level above dungeon level #1,
	       making the dummy level overlay level 1; but the whole reason
	       for having the dummy level is to make earth have depth -1
	       instead of 0, so adjust the start point to shift endgame up */
	    if (dunlevs_in_dungeon(&x->dlevel) > 1 - dungeons[i].depth_start)
		dungeons[i].depth_start -= 1;
	    /* TO DO: strip "dummy" out all the way here,
	       so that it's hidden from <ctrl/O> feedback. */
	}

	shuffle_planes();
}